

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxbmhandler.cpp
# Opt level: O3

bool QXbmHandler::canRead(QIODevice *device)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  undefined8 uVar4;
  QXbmHandler *this;
  long in_FS_OFFSET;
  int h;
  int w;
  undefined1 local_48 [16];
  QImageData *local_38;
  int local_28;
  int local_24;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (device == (QIODevice *)0x0) {
    this = (QXbmHandler *)QtPrivateLogging::lcImageIo();
    if ((this->state & 0x100) != Ready) {
      canRead(this);
    }
    bVar3 = false;
  }
  else {
    cVar1 = (**(code **)(*(long *)device + 0x60))();
    bVar3 = false;
    if (cVar1 == '\0') {
      local_38 = (QImageData *)&DAT_aaaaaaaaaaaaaaaa;
      local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QImage::QImage((QImage *)local_48);
      uVar4 = (**(code **)(*(long *)device + 0x78))(device);
      local_24 = 0;
      local_28 = 0;
      bVar2 = read_xbm_header(device,&local_24,&local_28);
      if (bVar2) {
        bVar3 = read_xbm_body(device,local_24,local_28,(QImage *)local_48);
      }
      (**(code **)(*(long *)device + 0x88))(device,uVar4);
      QImage::~QImage((QImage *)local_48);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool QXbmHandler::canRead(QIODevice *device)
{
    if (!device) {
        qCWarning(lcImageIo, "QXbmHandler::canRead() called with no device");
        return false;
    }

    // it's impossible to tell whether we can load an XBM or not when
    // it's from a sequential device, as the only way to do it is to
    // attempt to parse the whole image.
    if (device->isSequential())
        return false;

    QImage image;
    qint64 oldPos = device->pos();
    bool success = read_xbm_image(device, &image);
    device->seek(oldPos);

    return success;
}